

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void SelfTest(bool verbose)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  
  bVar2 = 1;
  for (lVar3 = 0x10; lVar3 != 0x1780; lVar3 = lVar3 + 0x28) {
    if (verbose) {
      printf("%20s - ",*(undefined8 *)((long)&g_hashes[0].hash + lVar3));
    }
    bVar1 = VerificationTest(*(pfHash *)((long)quality_str + lVar3 + 0x10),
                             *(int *)(lVar3 + 0x1ce398),*(uint32_t *)(lVar3 + 0x1ce39c),verbose);
    bVar2 = bVar2 & bVar1;
  }
  if (bVar2 != 0) {
    return;
  }
  puts("Self-test FAILED!");
  if (!verbose) {
    for (lVar3 = 0x10; lVar3 != 0x1780; lVar3 = lVar3 + 0x28) {
      printf("%20s - ",*(undefined8 *)((long)&g_hashes[0].hash + lVar3));
      VerificationTest(*(pfHash *)((long)quality_str + lVar3 + 0x10),*(int *)(lVar3 + 0x1ce398),
                       *(uint32_t *)(lVar3 + 0x1ce39c),true);
    }
  }
  exit(1);
}

Assistant:

void SelfTest(bool verbose) {
  bool pass = true;
  for (size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
    HashInfo *info = &g_hashes[i];
    if (verbose)
      printf("%20s - ", info->name);
    pass &= VerificationTest(info->hash, info->hashbits, info->verification,
                             verbose);
  }

  if (!pass) {
    printf("Self-test FAILED!\n");
    if (!verbose) {
      for (size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
        HashInfo *info = &g_hashes[i];
        printf("%20s - ", info->name);
        pass &= VerificationTest(info->hash, info->hashbits, info->verification,
                                 true);
      }
    }
    exit(1);
  }
}